

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O1

char * lws_generate_client_ws_handshake(lws *wsi,char *p,char *conn1)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  char hash [20];
  char key_b64 [40];
  char buf [128];
  uchar auStack_f8 [32];
  char local_d8 [39];
  undefined1 local_b1;
  uchar local_a8 [136];
  
  sVar2 = lws_get_random(wsi->context,auStack_f8,0x10);
  if (sVar2 == 0x10) {
    lws_b64_encode_string((char *)auStack_f8,0x10,local_d8,0x28);
    iVar1 = sprintf(p,"Upgrade: websocket\r\nConnection: %sUpgrade\r\nSec-WebSocket-Key: ",conn1);
    strcpy(p + iVar1,local_d8);
    sVar3 = strlen(local_d8);
    pcVar4 = p + iVar1 + sVar3;
    __s = pcVar4 + 2;
    pcVar4[0] = '\r';
    pcVar4[1] = '\n';
    *__s = '\0';
    pcVar4 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
    if (pcVar4 != (char *)0x0) {
      pcVar4 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
      iVar1 = sprintf(__s,"Sec-WebSocket-Protocol: %s\r\n",pcVar4);
      __s = __s + iVar1;
    }
    if (wsi->ws->ietf_spec_revision != '\0') {
      iVar1 = sprintf(__s,"Sec-WebSocket-Version: %d\r\n");
      __s = __s + iVar1;
    }
    local_b1 = 0;
    iVar1 = sprintf((char *)local_a8,"%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
    lws_SHA1(local_a8,(long)iVar1,auStack_f8);
    lws_b64_encode_string
              ((char *)auStack_f8,0x14,((wsi->http).ah)->initial_handshake_hash_base64,0x1e);
  }
  else {
    __s = (char *)0x0;
    _lws_log(1,"Unable to read from random dev %s\n","/dev/urandom");
  }
  return __s;
}

Assistant:

char *
lws_generate_client_ws_handshake(struct lws *wsi, char *p, const char *conn1)
{
	char buf[128], hash[20], key_b64[40];
	int n;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	const struct lws_extension *ext;
	int ext_count = 0;
#endif

	/*
	 * create the random key
	 */
	if (lws_get_random(wsi->context, hash, 16) != 16) {
		lwsl_err("Unable to read from random dev %s\n",
			 SYSTEM_RANDOM_FILEPATH);
		return NULL;
	}

	/* coverity[tainted_scalar] */
	lws_b64_encode_string(hash, 16, key_b64, sizeof(key_b64));

	p += sprintf(p, "Upgrade: websocket\x0d\x0a"
			"Connection: %sUpgrade\x0d\x0a"
			"Sec-WebSocket-Key: ", conn1);
	strcpy(p, key_b64);
	p += strlen(key_b64);
	p += sprintf(p, "\x0d\x0a");
	if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_SENT_PROTOCOLS))
		p += sprintf(p, "Sec-WebSocket-Protocol: %s\x0d\x0a",
		     lws_hdr_simple_ptr(wsi,
				     _WSI_TOKEN_CLIENT_SENT_PROTOCOLS));

	/* tell the server what extensions we could support */

#if !defined(LWS_WITHOUT_EXTENSIONS)
	ext = wsi->vhost->ws.extensions;
	while (ext && ext->callback) {

		n = wsi->vhost->protocols[0].callback(wsi,
			LWS_CALLBACK_CLIENT_CONFIRM_EXTENSION_SUPPORTED,
				wsi->user_space, (char *)ext->name, 0);

		/*
		 * zero return from callback means go ahead and allow
		 * the extension, it's what we get if the callback is
		 * unhandled
		 */

		if (n) {
			ext++;
			continue;
		}

		/* apply it */

		if (ext_count)
			*p++ = ',';
		else
			p += sprintf(p, "Sec-WebSocket-Extensions: ");
		p += sprintf(p, "%s", ext->client_offer);
		ext_count++;

		ext++;
	}
	if (ext_count)
		p += sprintf(p, "\x0d\x0a");
#endif

	if (wsi->ws->ietf_spec_revision)
		p += sprintf(p, "Sec-WebSocket-Version: %d\x0d\x0a",
			     wsi->ws->ietf_spec_revision);

	/* prepare the expected server accept response */

	key_b64[39] = '\0'; /* enforce composed length below buf sizeof */
	n = sprintf(buf, "%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11",
			  key_b64);

	lws_SHA1((unsigned char *)buf, n, (unsigned char *)hash);

	lws_b64_encode_string(hash, 20,
		  wsi->http.ah->initial_handshake_hash_base64,
		  sizeof(wsi->http.ah->initial_handshake_hash_base64));

	return p;
}